

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Permutazione.cpp
# Opt level: O0

void __thiscall Permutazione::somma(Permutazione *this,Permutazione *p)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  unsigned_short *puVar3;
  ushort local_22;
  unsigned_short k;
  unsigned_short *individuo;
  Permutazione *p_local;
  Permutazione *this_local;
  
  auVar1 = ZEXT216(this->dimensione) * ZEXT816(2);
  uVar2 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  puVar3 = (unsigned_short *)operator_new__(uVar2);
  for (local_22 = 0; local_22 < this->dimensione; local_22 = local_22 + 1) {
    puVar3[local_22] = p->individuo[this->individuo[local_22]];
  }
  if (this->individuo != (unsigned_short *)0x0) {
    operator_delete__(this->individuo);
  }
  this->individuo = puVar3;
  return;
}

Assistant:

void Permutazione::somma(Permutazione* p) {

	unsigned short* individuo = new unsigned short[dimensione];

	for (unsigned short k = 0; k < dimensione; k++) {
		individuo[k] = p->individuo[this->individuo[k]];
	}

	delete[] this->individuo;
	this->individuo = individuo;
}